

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblk_compr.c
# Opt level: O0

UINT8 CompressDataBlk(UINT32 outLen,UINT8 *outData,UINT32 inLen,UINT8 *inData,PCM_CMP_INF *cmprInfo)

{
  char cVar1;
  UINT8 local_32;
  UINT8 retVal;
  UINT8 valSize;
  PCM_CMP_INF *cmprInfo_local;
  UINT8 *inData_local;
  UINT32 inLen_local;
  UINT8 *outData_local;
  UINT32 outLen_local;
  
  if (cmprInfo->comprType == '\0') {
    cVar1 = (char)((ulong)(cmprInfo->bitsDec + 7) / 8);
    if (cVar1 == '\x01') {
      local_32 = Compress_BitPacking_8(outLen,outData,inLen,inData,cmprInfo);
    }
    else if (cVar1 == '\x02') {
      local_32 = Compress_BitPacking_16(outLen,outData,inLen,inData,cmprInfo);
    }
    else {
      local_32 = ' ';
    }
    if (local_32 == '\0') {
      outData_local._7_1_ = '\0';
    }
    else {
      outData_local._7_1_ = local_32;
    }
  }
  else {
    outData_local._7_1_ = 0x80;
  }
  return outData_local._7_1_;
}

Assistant:

UINT8 CompressDataBlk(UINT32 outLen, UINT8* outData, UINT32 inLen, const UINT8* inData, const PCM_CMP_INF* cmprInfo)
{
	UINT8 valSize;
	UINT8 retVal;
	
	switch(cmprInfo->comprType)
	{
	case 0x00:	// Bit Packing compression
		valSize = (cmprInfo->bitsDec + 7) / 8;
		if (valSize == 0x01)
			retVal = Compress_BitPacking_8(outLen, outData, inLen, inData, cmprInfo);
		else if (valSize == 0x02)
			retVal = Compress_BitPacking_16(outLen, outData, inLen, inData, cmprInfo);
		else
			retVal = 0x20;	// invalid number of decompressed bits
		if (retVal)
			return retVal;
		break;
	default:
		return 0x80;
	}
	
	return 0x00;
}